

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall
HPresolve::getBoundOnLByZj
          (HPresolve *this,int row,int j,double *lo,double *up,double colLow,double colUpp)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  reference pvVar1;
  reference pvVar2;
  size_type __n;
  size_type __n_00;
  double dVar3;
  double dVar4;
  double *local_88;
  double local_68;
  
  __n = (size_type)j;
  pvVar1 = std::vector<double,_std::allocator<double>_>::at(&(this->super_HPreData).colCostAtEl,__n)
  ;
  dVar4 = *pvVar1;
  pvVar2 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).Astart,__n);
  this_00 = &(this->super_HPreData).Aindex;
  local_68 = 0.0;
  for (__n_00 = (size_type)*pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).Aend,__n),
      (long)__n_00 < (long)*pvVar2; __n_00 = __n_00 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_00,__n_00);
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       (&(this->super_HPreData).flagRow,(long)*pvVar2);
    if (*pvVar2 != 0) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::at
                         (&(this->super_HPreData).Avalue,__n_00);
      dVar3 = *pvVar1;
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_00,__n_00);
      pvVar1 = std::vector<double,_std::allocator<double>_>::at
                         (&(this->super_HPreData).valueRowDual,(long)*pvVar2);
      local_68 = local_68 + dVar3 * *pvVar1;
    }
  }
  dVar3 = HPreData::getaij(&this->super_HPreData,row,j);
  if (ABS(colLow - colUpp) < this->tol) {
    return;
  }
  dVar4 = (-dVar4 - local_68) / dVar3;
  this_01 = &(this->super_HPreData).valuePrimal;
  pvVar1 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
  if ((*pvVar1 - colLow < this->tol || *pvVar1 - colLow == this->tol) ||
     (pvVar1 = std::vector<double,_std::allocator<double>_>::at(this_01,__n),
     colUpp - *pvVar1 < this->tol || colUpp - *pvVar1 == this->tol)) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
    if (0.0 <= dVar3) {
LAB_00148282:
      pvVar1 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
      if ((dVar3 <= 0.0) || ((*pvVar1 != colUpp || (NAN(*pvVar1) || NAN(colUpp))))) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
        if (0.0 < dVar3) {
          if ((*pvVar1 == colLow) && (!NAN(*pvVar1) && !NAN(colLow))) goto LAB_00148327;
        }
        pvVar1 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
        if (0.0 <= dVar3) {
          return;
        }
        if (*pvVar1 != colUpp) {
          return;
        }
        if (NAN(*pvVar1) || NAN(colUpp)) {
          return;
        }
        goto LAB_00148327;
      }
    }
    else if ((*pvVar1 != colLow) || (NAN(*pvVar1) || NAN(colLow))) goto LAB_00148282;
    local_88 = up;
    if (*up <= dVar4) {
      return;
    }
  }
  else {
    if (dVar4 < *up) {
      *up = dVar4;
    }
LAB_00148327:
    local_88 = lo;
    if (dVar4 < *lo || dVar4 == *lo) {
      return;
    }
  }
  *local_88 = dVar4;
  return;
}

Assistant:

void HPresolve::getBoundOnLByZj(int row, int j, double* lo, double* up, double colLow, double colUpp) {

	double cost = colCostAtEl.at(j);//valueColDual.at(j);
	double x = -cost;

	double sum = 0;
	for (int kk=Astart.at(j); kk<Aend.at(j);++kk)
		if (flagRow.at(Aindex.at(kk))) {
			sum = sum + Avalue.at(kk)*valueRowDual.at(Aindex.at(kk));
		}
	x = x - sum;

	double aij=getaij(row,j);
	x = x/aij;


	if (abs(colLow-colUpp) < tol)
		return; //here there is no restriction on zj so no bound on y

	if ((valuePrimal.at(j) - colLow) > tol && (colUpp - valuePrimal.at(j)) > tol) {
		//set both bounds
		if (x<*up)
			*up = x;
		if (x>*lo)
			*lo = x;
	}

	else if ((valuePrimal.at(j) == colLow && aij<0) || (valuePrimal.at(j) == colUpp && aij>0)) {
		if (x<*up)
			*up = x;
	}
	else if ((valuePrimal.at(j) == colLow && aij>0) || (valuePrimal.at(j) == colUpp && aij<0)) {
		if (x>*lo)
			*lo = x;
	}
}